

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O2

char * RTMath::display(char *label,RTMatrix4x4 *mat)

{
  sprintf(m_string,
          "%s(0): %f %f %f %f\n%s(1): %f %f %f %f\n%s(2): %f %f %f %f\n%s(3): %f %f %f %f\n",
          (double)mat->m_data[0][0],(double)mat->m_data[0][1],(double)mat->m_data[0][2],
          (double)mat->m_data[0][3],(double)mat->m_data[1][0],(double)mat->m_data[1][1],
          (double)mat->m_data[1][2],(double)mat->m_data[1][3],label,label,label,label,
          (double)mat->m_data[2][0],(double)mat->m_data[2][1],(double)mat->m_data[2][2],
          (double)mat->m_data[2][3],(double)mat->m_data[3][0],(double)mat->m_data[3][1],
          (double)mat->m_data[3][2],(double)mat->m_data[3][3]);
  return m_string;
}

Assistant:

const char *RTMath::display(const char *label, RTMatrix4x4& mat)
{
    sprintf(m_string, "%s(0): %f %f %f %f\n%s(1): %f %f %f %f\n%s(2): %f %f %f %f\n%s(3): %f %f %f %f\n",
            label, mat.val(0,0), mat.val(0,1), mat.val(0,2), mat.val(0,3),
            label, mat.val(1,0), mat.val(1,1), mat.val(1,2), mat.val(1,3),
            label, mat.val(2,0), mat.val(2,1), mat.val(2,2), mat.val(2,3),
            label, mat.val(3,0), mat.val(3,1), mat.val(3,2), mat.val(3,3));
    return m_string;
}